

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::mdc_formatter<spdlog::details::scoped_padder>::format
          (mdc_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *param_3,
          memory_buf_t *dest)

{
  bool bVar1;
  scoped_padder p;
  mdc_map_t *mdc_map;
  memory_buf_t *in_stack_00000070;
  mdc_map_t *in_stack_00000078;
  mdc_formatter<spdlog::details::scoped_padder> *in_stack_00000080;
  scoped_padder *in_stack_ffffffffffffffb0;
  memory_buf_t *in_stack_ffffffffffffffb8;
  padding_info *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  scoped_padder *in_stack_ffffffffffffffd0;
  
  mdc::get_context_abi_cxx11_();
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x5fcee5);
  if (bVar1) {
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
    scoped_padder::~scoped_padder(in_stack_ffffffffffffffb0);
  }
  else {
    format_mdc(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override {
        auto &mdc_map = mdc::get_context();
        if (mdc_map.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        } else {
            format_mdc(mdc_map, dest);
        }
    }